

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<bool_(unsigned_short)>::UntypedPerformAction
          (FunctionMocker<bool_(unsigned_short)> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<bool> *pAVar1;
  ArgumentTuple *args;
  Action<bool_(unsigned_short)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<bool_(unsigned_short)> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<bool_(unsigned_short)>::Action
            ((Action<bool_(unsigned_short)> *)&args,(Action<bool_(unsigned_short)> *)untyped_action)
  ;
  pAVar1 = ActionResultHolder<bool>::PerformAction<bool(unsigned_short)>
                     ((Action<bool_(unsigned_short)> *)&args,(ArgumentTuple *)action.fun_._M_invoker
                     );
  Action<bool_(unsigned_short)>::~Action((Action<bool_(unsigned_short)> *)&args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }